

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_clear(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  list_head *plVar1;
  undefined1 auVar2 [16];
  list_head *plVar3;
  JSMapState *s;
  ulong uVar4;
  
  s = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (s == (JSMapState *)0x0) {
    uVar4 = 6;
  }
  else {
    uVar4 = 3;
    plVar3 = (s->records).next;
    while (plVar3 != &s->records) {
      plVar1 = plVar3->next;
      map_delete_record(ctx->rt,s,(JSMapRecord *)&plVar3[-2].next);
      plVar3 = plVar1;
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  return (JSValue)(auVar2 << 0x40);
}

Assistant:

static JSValue js_map_clear(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    struct list_head *el, *el1;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    list_for_each_safe(el, el1, &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        map_delete_record(ctx->rt, s, mr);
    }
    return JS_UNDEFINED;
}